

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int is_let(JSParseState *s,int decl_mask)

{
  BOOL BVar1;
  int iVar2;
  uint in_ESI;
  JSParseState *in_RDI;
  JSParsePos pos;
  int res;
  JSParseState *in_stack_00000038;
  JSParsePos *in_stack_ffffffffffffffd8;
  JSParseState *in_stack_ffffffffffffffe0;
  int local_10;
  
  local_10 = 0;
  BVar1 = token_is_pseudo_keyword(in_RDI,0x27);
  if (BVar1 != 0) {
    js_parse_get_pos(in_RDI,(JSParsePos *)&stack0xffffffffffffffd8);
    iVar2 = next_token(in_stack_00000038);
    if (iVar2 == 0) {
      if ((in_RDI->token).val == 0x5b) {
        local_10 = 1;
      }
      else if (((((in_RDI->token).val == 0x7b) ||
                ((((in_RDI->token).val == -0x7d && ((in_RDI->token).u.ident.is_reserved == 0)) ||
                 ((in_RDI->token).val == -0x2f)))) ||
               (((in_RDI->token).val == -0x29 || ((in_RDI->token).val == -0x28)))) &&
              ((in_RDI->last_line_num == (in_RDI->token).line_num || ((in_ESI & 4) != 0)))) {
        local_10 = 1;
      }
    }
    else {
      local_10 = -1;
    }
    iVar2 = js_parse_seek_token(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (iVar2 != 0) {
      local_10 = -1;
    }
  }
  return local_10;
}

Assistant:

static int is_let(JSParseState *s, int decl_mask)
{
    int res = FALSE;

    if (token_is_pseudo_keyword(s, JS_ATOM_let)) {
#if 1
        JSParsePos pos;
        js_parse_get_pos(s, &pos);
        for (;;) {
            if (next_token(s)) {
                res = -1;
                break;
            }
            if (s->token.val == '[') {
                /* let [ is a syntax restriction:
                   it never introduces an ExpressionStatement */
                res = TRUE;
                break;
            }
            if (s->token.val == '{' ||
                (s->token.val == TOK_IDENT && !s->token.u.ident.is_reserved) ||
                s->token.val == TOK_LET ||
                s->token.val == TOK_YIELD ||
                s->token.val == TOK_AWAIT) {
                /* Check for possible ASI if not scanning for Declaration */
                /* XXX: should also check that `{` introduces a BindingPattern,
                   but Firefox does not and rejects eval("let=1;let\n{if(1)2;}") */
                if (s->last_line_num == s->token.line_num || (decl_mask & DECL_MASK_OTHER)) {
                    res = TRUE;
                    break;
                }
                break;
            }
            break;
        }
        if (js_parse_seek_token(s, &pos)) {
            res = -1;
        }
#else
        int tok = peek_token(s, TRUE);
        if (tok == '{' || tok == TOK_IDENT || peek_token(s, FALSE) == '[') {
            res = TRUE;
        }
#endif
    }
    return res;
}